

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LocalTableManager::InsertEntry
          (LocalTableManager *this,DataTable *table,
          shared_ptr<duckdb::LocalTableStorage,_true> *entry)

{
  mapped_type *this_00;
  key_type local_20;
  
  ::std::mutex::lock(&this->table_storage_lock);
  local_20._M_data = table;
  this_00 = ::std::__detail::
            _Map_base<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_duckdb::shared_ptr<duckdb::LocalTableStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->table_storage,&local_20);
  shared_ptr<duckdb::LocalTableStorage,_true>::operator=(this_00,entry);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void LocalTableManager::InsertEntry(DataTable &table, shared_ptr<LocalTableStorage> entry) {
	lock_guard<mutex> l(table_storage_lock);
	D_ASSERT(table_storage.find(table) == table_storage.end());
	table_storage[table] = std::move(entry);
}